

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

vector bucket_get_pairs_value(bucket b,comparable_callback compare_cb,void *key)

{
  pair ppVar1;
  int iVar2;
  vector v;
  ulong uVar3;
  long lVar4;
  
  if (b->pairs != (pair)0x0) {
    lVar4 = 8;
    v = vector_create(8);
    for (uVar3 = 0; uVar3 < b->count; uVar3 = uVar3 + 1) {
      ppVar1 = b->pairs;
      iVar2 = (*compare_cb)(key,*(comparable *)((long)ppVar1 + lVar4 + -8));
      if (iVar2 == 0) {
        vector_push_back(v,(void *)((long)&ppVar1->key + lVar4));
      }
      lVar4 = lVar4 + 0x10;
    }
    return v;
  }
  return (vector)0x0;
}

Assistant:

vector bucket_get_pairs_value(bucket b, comparable_callback compare_cb, void *key)
{
	size_t iterator;
	vector v;

	if (b->pairs == NULL)
	{
		return NULL;
	}

	v = vector_create(sizeof(void *));

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			vector_push_back(v, &p->value);
		}
	}

	return v;
}